

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int testnext(LexState *ls,int c)

{
  bool bVar1;
  
  bVar1 = (ls->t).token == c;
  if (bVar1) {
    luaX_next(ls);
  }
  return (uint)bVar1;
}

Assistant:

static int testnext(LexState*ls,int c){
if(ls->t.token==c){
luaX_next(ls);
return 1;
}
else return 0;
}